

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_SH_AUTH_SESSION_Unmarshal
                 (TPMI_SH_AUTH_SESSION *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_SH_AUTH_SESSION *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (*target == 0x40000009) {
      if (flag == 0) {
        target_local._4_4_ = 0x84;
      }
      else {
        target_local._4_4_ = 0;
      }
    }
    else if (((*target < 0x2000000) || (0x200003f < *target)) &&
            ((*target < 0x3000000 || (0x300003f < *target)))) {
      target_local._4_4_ = 0x84;
    }
    else {
      target_local._4_4_ = 0;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_SH_AUTH_SESSION_Unmarshal(TPMI_SH_AUTH_SESSION *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
   if (*target == TPM_RS_PW) {
        if(flag)
            return TPM_RC_SUCCESS;
        else
            return TPM_RC_VALUE;
    }
    if(((*target < HMAC_SESSION_FIRST) || (*target > HMAC_SESSION_LAST))
      &&((*target < POLICY_SESSION_FIRST) || (*target > POLICY_SESSION_LAST)))
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}